

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void imtqlx(int n,double *d,double *e,double *z)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int local_40;
  int local_3c;
  
  if (n != 1) {
    e[(long)n + -1] = 0.0;
    if (0 < n) {
      uVar1 = (ulong)(uint)n;
      uVar4 = 1;
      local_3c = 0;
LAB_001cd274:
      local_40 = 0;
      do {
        uVar3 = uVar4 & 0xffffffff;
        uVar6 = uVar4;
        if (uVar4 < uVar1) {
          do {
            uVar3 = uVar6;
            if (ABS(e[uVar6 - 1]) <= (ABS(d[uVar6]) + ABS(d[uVar6 - 1])) * 2.220446049250313e-16)
            break;
            uVar6 = uVar6 + 1;
            uVar3 = uVar1;
          } while (uVar1 != uVar6);
        }
        iVar5 = (int)uVar3;
        if (uVar4 == (uVar3 & 0xffffffff)) goto LAB_001cd5ed;
        if (local_40 == 0x1e) {
          std::operator<<((ostream *)&std::cerr,"\n");
          std::operator<<((ostream *)&std::cerr,"IMTQLX - Fatal error!\n");
          std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded\n");
          exit(1);
        }
        dVar11 = d[uVar4 - 1];
        dVar10 = (d[uVar4] - dVar11) / (e[uVar4 - 1] + e[uVar4 - 1]);
        dVar8 = dVar10 * dVar10 + 1.0;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
        dVar13 = 0.0;
        dVar11 = e[uVar4 - 1] /
                 (ABS(dVar8) * *(double *)(&DAT_00222470 + (ulong)(dVar10 < 0.0) * 8) + dVar10) +
                 (d[(long)iVar5 + -1] - dVar11);
        if ((int)uVar4 < iVar5) {
          lVar7 = -1;
          dVar10 = 1.0;
          dVar8 = 1.0;
          do {
            dVar12 = e[(long)iVar5 + lVar7 + -1];
            dVar10 = dVar10 * dVar12;
            if (ABS(dVar11) <= ABS(dVar10)) {
              dVar11 = dVar11 / dVar10;
              dVar9 = dVar11 * dVar11 + 1.0;
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              e[iVar5 + lVar7] = dVar10 * dVar9;
              dVar10 = 1.0 / dVar9;
              dVar9 = dVar11 * dVar10;
            }
            else {
              dVar10 = dVar10 / dVar11;
              dVar9 = dVar10 * dVar10 + 1.0;
              if (dVar9 < 0.0) {
                dVar9 = sqrt(dVar9);
              }
              else {
                dVar9 = SQRT(dVar9);
              }
              e[iVar5 + lVar7] = dVar11 * dVar9;
              dVar9 = 1.0 / dVar9;
              dVar10 = dVar10 * dVar9;
            }
            dVar8 = dVar8 * dVar12;
            dVar11 = d[iVar5 + lVar7] - dVar13;
            dVar12 = (d[(long)iVar5 + lVar7 + -1] - dVar11) * dVar10 + (dVar9 + dVar9) * dVar8;
            dVar13 = dVar10 * dVar12;
            d[iVar5 + lVar7] = dVar11 + dVar13;
            dVar11 = dVar12 * dVar9 - dVar8;
            dVar8 = z[iVar5 + lVar7];
            z[iVar5 + lVar7] = dVar10 * z[(long)iVar5 + lVar7 + -1] + dVar9 * dVar8;
            z[(long)iVar5 + lVar7 + -1] = z[(long)iVar5 + lVar7 + -1] * dVar9 - dVar8 * dVar10;
            lVar7 = lVar7 + -1;
            dVar8 = dVar9;
          } while (-lVar7 != (ulong)(uint)(iVar5 + local_3c));
        }
        local_40 = local_40 + 1;
        d[uVar4 - 1] = d[uVar4 - 1] - dVar13;
        e[uVar4 - 1] = dVar11;
        e[(long)iVar5 + -1] = 0.0;
      } while( true );
    }
    iVar5 = 0;
LAB_001cd605:
    if (1 < iVar5) {
      uVar1 = 2;
      do {
        uVar4 = uVar1 - 1;
        dVar11 = d[uVar1 - 2];
        uVar2 = (uint)uVar4;
        dVar8 = dVar11;
        if ((long)uVar1 <= (long)n) {
          uVar6 = uVar4 & 0xffffffff;
          uVar3 = uVar1;
          dVar10 = dVar11;
          do {
            dVar8 = d[uVar3 - 1];
            if (dVar8 < dVar10) {
              uVar6 = uVar3 & 0xffffffff;
            }
            uVar2 = (uint)uVar6;
            if (dVar10 <= dVar8) {
              dVar8 = dVar10;
            }
            uVar3 = uVar3 + 1;
            dVar10 = dVar8;
          } while (n + 1 != uVar3);
        }
        if (uVar4 != uVar2) {
          d[(long)(int)uVar2 + -1] = dVar11;
          d[uVar1 - 2] = dVar8;
          dVar11 = z[uVar1 - 2];
          z[uVar1 - 2] = z[(long)(int)uVar2 + -1];
          z[(long)(int)uVar2 + -1] = dVar11;
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 != iVar5 + 1);
    }
  }
  return;
LAB_001cd5ed:
  uVar4 = uVar4 + 1;
  local_3c = local_3c + -1;
  if (uVar4 == n + 1) goto LAB_001cd605;
  goto LAB_001cd274;
}

Assistant:

void imtqlx ( int n, double d[], double e[], double z[] )

//****************************************************************************80
//
//  Purpose:
//
//    IMTQLX diagonalizes a symmetric tridiagonal matrix.
//
//  Discussion:
//
//    This routine is a slightly modified version of the EISPACK routine to 
//    perform the implicit QL algorithm on a symmetric tridiagonal matrix. 
//
//    The authors thank the authors of EISPACK for permission to use this
//    routine. 
//
//    It has been modified to produce the product Q' * Z, where Z is an input 
//    vector and Q is the orthogonal matrix diagonalizing the input matrix.  
//    The changes consist (essentially) of applying the orthogonal transformations
//    directly to Z as they are generated.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    08 January 2010
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of 
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//    Roger Martin, James Wilkinson,
//    The Implicit QL Algorithm,
//    Numerische Mathematik,
//    Volume 12, Number 5, December 1968, pages 377-383.
//
//  Parameters:
//
//    Input, int N, the order of the matrix.
//
//    Input/output, double D(N), the diagonal entries of the matrix.
//    On output, the information in D has been overwritten.
//
//    Input/output, double E(N), the subdiagonal entries of the 
//    matrix, in entries E(1) through E(N-1).  On output, the information in
//    E has been overwritten.
//
//    Input/output, double Z(N).  On input, a vector.  On output,
//    the value of Q' * Z, where Q is the matrix that diagonalizes the
//    input symmetric tridiagonal matrix.
//
{
  double b;
  double c;
  double f;
  double g;
  int i;
  int ii;
  int itn = 30;
  int j;
  int k;
  int l;
  int m = 0; // Silence uninitialized warning.
  int mml;
  double p;
  double prec;
  double r;
  double s;

  prec = r8_epsilon ( );

  if ( n == 1 )
  {
    return;
  }

  e[n-1] = 0.0;

  for ( l = 1; l <= n; l++ )
  {
    j = 0;
    for ( ; ; )
    {
      for ( m = l; m <= n; m++ )
      {
        if ( m == n )
        {
          break;
        }

        if ( fabs ( e[m-1] ) <= prec * ( fabs ( d[m-1] ) + fabs ( d[m] ) ) )
        {
          break;
        }
      }
      p = d[l-1];
      if ( m == l )
      {
        break;
      }
      if ( itn <= j )
      {
        std::cerr << "\n";
        std::cerr << "IMTQLX - Fatal error!\n";
        std::cerr << "  Iteration limit exceeded\n";
        exit ( 1 );
      }
      j = j + 1;
      g = ( d[l] - p ) / ( 2.0 * e[l-1] );
      r = sqrt ( g * g + 1.0 );
      g = d[m-1] - p + e[l-1] / ( g + fabs ( r ) * r8_sign ( g ) );
      s = 1.0;
      c = 1.0;
      p = 0.0;
      mml = m - l;

      for ( ii = 1; ii <= mml; ii++ )
      {
        i = m - ii;
        f = s * e[i-1];
        b = c * e[i-1];

        if ( fabs ( g ) <= fabs ( f ) )
        {
          c = g / f;
          r = sqrt ( c * c + 1.0 );
          e[i] = f * r;
          s = 1.0 / r;
          c = c * s;
        }
        else
        {
          s = f / g;
          r = sqrt ( s * s + 1.0 );
          e[i] = g * r;
          c = 1.0 / r;
          s = s * c;
        }
        g = d[i] - p;
        r = ( d[i-1] - g ) * s + 2.0 * c * b;
        p = s * r;
        d[i] = g + p;
        g = c * r - b;
        f = z[i];
        z[i] = s * z[i-1] + c * f;
        z[i-1] = c * z[i-1] - s * f;
      }
      d[l-1] = d[l-1] - p;
      e[l-1] = g;
      e[m-1] = 0.0;
    }
  }
//
//  Sorting.
//
  for ( ii = 2; ii <= m; ii++ )
  {
    i = ii - 1;
    k = i;
    p = d[i-1];

    for ( j = ii; j <= n; j++ )
    {
      if ( d[j-1] < p )
      {
         k = j;
         p = d[j-1];
      }
    }

    if ( k != i )
    {
      d[k-1] = d[i-1];
      d[i-1] = p;
      p = z[i-1];
      z[i-1] = z[k-1];
      z[k-1] = p;
    }
  }
  return;
}